

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_compute_fluxes_from_state.cpp
# Opt level: O0

void HydroUtils::ComputeFluxesOnBoxFromState
               (Box *bx,int ncomp,MFIter *mfi,Array4<const_double> *q,Array4<double> *flux_x,
               Array4<double> *flux_y,Array4<double> *flux_z,Array4<double> *face_x,
               Array4<double> *face_y,Array4<double> *face_z,bool knownFaceState,
               Array4<const_double> *u_mac,Array4<const_double> *v_mac,Array4<const_double> *w_mac,
               Array4<const_double> *divu,Array4<const_double> *fq,Geometry geom,Real l_dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *d_bcrec,
               int *iconserv,EBFArrayBoxFactory *ebfact,Array4<const_double> *values_on_eb_inflow,
               bool godunov_use_ppm,bool godunov_use_forces_in_trans,bool is_velocity,
               bool fluxes_are_area_weighted,string *advection_type)

{
  Geometry geom_00;
  bool bVar1;
  FabType FVar2;
  long lVar3;
  undefined4 in_ESI;
  undefined8 *puVar4;
  int *in_RDI;
  Geometry **ppGVar5;
  byte bVar6;
  Array4<double> *in_stack_00000010;
  Array4<double> *in_stack_00000018;
  Array4<double> *in_stack_00000020;
  byte in_stack_00000028;
  Elixir *in_stack_00000038;
  Geometry *in_stack_00000128;
  byte in_stack_00000148;
  byte in_stack_00000150;
  byte in_stack_00000158;
  byte in_stack_00000160;
  undefined1 in_stack_00000233;
  int in_stack_00000234;
  Array4<const_double> *in_stack_00000238;
  Array4<double> *in_stack_00000240;
  Array4<double> *in_stack_00000248;
  Array4<double> *in_stack_00000250;
  Box *in_stack_00000258;
  Array4<const_double> *in_stack_000003a0;
  Array4<const_double> *in_stack_000003a8;
  Array4<const_double> *in_stack_000003b0;
  Box *in_stack_000003b8;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_000003c0;
  BCRec *in_stack_000003c8;
  Array4<const_double> *in_stack_000003d0;
  Array4<const_double> *in_stack_000003d8;
  Array4<const_double> *in_stack_000003e0;
  Array4<const_double> *in_stack_000003e8;
  Array4<const_double> *in_stack_000003f0;
  Array4<const_amrex::EBCellFlag> *in_stack_000003f8;
  Elixir eli;
  Box result_1;
  FArrayBox tmpfab_v;
  int ngrow;
  Box result;
  bool regular;
  Array4<const_double> apz;
  Array4<const_double> apy;
  Array4<const_double> apx;
  Array4<const_double> vfrac;
  Array4<const_double> ccc;
  Array4<const_double> fcz;
  Array4<const_double> fcy;
  Array4<const_double> fcx;
  Array4<const_amrex::EBCellFlag> *flag;
  EBCellFlagFab *flagfab;
  undefined1 in_stack_0000209d;
  undefined1 in_stack_0000209e;
  undefined1 in_stack_0000209f;
  Real in_stack_000020a0;
  Array4<double> *in_stack_000020a8;
  Array4<double> *in_stack_000020b0;
  Array4<double> *in_stack_000020b8;
  Array4<const_double> *in_stack_000020c0;
  int in_stack_000020cc;
  Box *in_stack_000020d0;
  undefined1 in_stack_00002457;
  Real in_stack_00002458;
  Array4<double> *in_stack_00002460;
  Array4<double> *in_stack_00002468;
  Array4<double> *in_stack_00002470;
  Array4<const_double> *in_stack_00002478;
  int in_stack_00002484;
  Box *in_stack_00002488;
  Array4<const_double> *in_stack_000038f0;
  Array4<const_double> *in_stack_000038f8;
  Array4<const_double> *in_stack_00003900;
  Array4<const_double> *in_stack_00003908;
  Array4<const_double> *in_stack_00003910;
  Geometry in_stack_00003918;
  BCRec *in_stack_000039e0;
  int *in_stack_000039e8;
  Array4<const_double> *in_stack_00003cc0;
  Array4<const_double> *in_stack_00003cc8;
  Array4<const_double> *in_stack_00003cd0;
  Array4<const_double> *in_stack_00003cd8;
  Array4<const_double> *in_stack_00003ce0;
  Geometry *in_stack_00003ce8;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_00003cf0;
  BCRec *in_stack_00003cf8;
  int *in_stack_00003d00;
  Real *in_stack_00003d08;
  Array4<const_amrex::EBCellFlag> *in_stack_00003d10;
  Array4<const_double> *in_stack_00003d18;
  Array4<const_double> *in_stack_00003d20;
  Array4<const_double> *in_stack_00003d28;
  Array4<const_double> *in_stack_00003d30;
  Array4<const_double> *in_stack_00003d38;
  Array4<const_double> *in_stack_00003d40;
  Array4<const_double> *in_stack_00003d48;
  Array4<const_double> *in_stack_00003d50;
  Array4<const_double> *in_stack_00003d60;
  MFIter *in_stack_fffffffffffff268;
  MultiCutFab *in_stack_fffffffffffff270;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff278;
  FArrayBox *in_stack_fffffffffffff280;
  int n;
  BaseFab<double> *in_stack_fffffffffffff288;
  Geometry *local_d70;
  BaseFab<double> *in_stack_fffffffffffff298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2b0;
  char *in_stack_fffffffffffff2b8;
  Box *in_stack_fffffffffffff390;
  EBCellFlagFab *in_stack_fffffffffffff398;
  undefined4 in_stack_fffffffffffff48c;
  Real in_stack_fffffffffffff490;
  Array4<double> *in_stack_fffffffffffff498;
  Array4<double> *in_stack_fffffffffffff4a0;
  Array4<double> *in_stack_fffffffffffff4a8;
  undefined4 in_stack_fffffffffffff4b0;
  undefined4 in_stack_fffffffffffff4b4;
  undefined8 in_stack_fffffffffffff4b8;
  Box *in_stack_fffffffffffff4c0;
  Array4<const_double> local_a68;
  undefined1 in_stack_fffffffffffff5df;
  Array4<const_double> *in_stack_fffffffffffff5e0;
  Array4<const_double> *in_stack_fffffffffffff5e8;
  Array4<double> *in_stack_fffffffffffff5f0;
  Array4<double> *in_stack_fffffffffffff5f8;
  Array4<double> *in_stack_fffffffffffff600;
  Box *in_stack_fffffffffffff608;
  Array4<const_double> local_9e8;
  Array4<const_double> local_9a8;
  Array4<const_double> local_968;
  Array4<const_double> *in_stack_fffffffffffff700;
  Array4<const_double> *in_stack_fffffffffffff708;
  Array4<const_double> *in_stack_fffffffffffff710;
  Array4<const_double> *in_stack_fffffffffffff718;
  Array4<const_double> *in_stack_fffffffffffff720;
  undefined1 in_stack_fffffffffffff728 [55];
  undefined1 in_stack_fffffffffffff75f;
  Array4<const_double> *in_stack_fffffffffffff760;
  Array4<const_double> *in_stack_fffffffffffff768;
  Array4<double> *in_stack_fffffffffffff770;
  Array4<double> *in_stack_fffffffffffff778;
  Array4<double> *in_stack_fffffffffffff780;
  Box *in_stack_fffffffffffff788;
  undefined1 auVar7 [24];
  undefined1 auVar8 [12];
  undefined1 in_stack_fffffffffffff790 [96];
  undefined1 auVar9 [28];
  BCRec *in_stack_fffffffffffff7f0;
  int *in_stack_fffffffffffff7f8;
  undefined8 local_800 [2];
  Array4<const_double> *in_stack_fffffffffffff810;
  Array4<const_double> *in_stack_fffffffffffff818;
  Array4<const_double> *in_stack_fffffffffffff820;
  Array4<const_double> *in_stack_fffffffffffff828;
  Geometry *in_stack_fffffffffffff830;
  int in_stack_fffffffffffff838;
  undefined1 in_stack_fffffffffffff8a3;
  int in_stack_fffffffffffff8a4;
  Array4<const_double> *in_stack_fffffffffffff8a8;
  Array4<double> *in_stack_fffffffffffff8b0;
  Array4<double> *in_stack_fffffffffffff8b8;
  Array4<double> *in_stack_fffffffffffff8c0;
  Box *in_stack_fffffffffffff8c8;
  Box local_70c [3];
  undefined4 local_6a4;
  undefined1 local_688 [24];
  Array4<const_double> *in_stack_fffffffffffff990;
  Array4<const_double> *in_stack_fffffffffffff998;
  Array4<const_double> *in_stack_fffffffffffff9a0;
  Array4<const_double> *in_stack_fffffffffffff9a8;
  Array4<const_double> *in_stack_fffffffffffff9b0;
  Array4<const_double> *in_stack_fffffffffffff9b8;
  Array4<const_double> *in_stack_fffffffffffff9c0;
  Geometry *in_stack_fffffffffffff9c8;
  int in_stack_fffffffffffff9d0;
  Array4<const_amrex::EBCellFlag> *in_stack_fffffffffffff9d8;
  Array4<const_double> *in_stack_fffffffffffffa10;
  Array4<const_double> *in_stack_fffffffffffffa18;
  Array4<const_double> *in_stack_fffffffffffffa20;
  Box *in_stack_fffffffffffffa28;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_fffffffffffffa30;
  BCRec *in_stack_fffffffffffffa38;
  undefined1 local_580 [88];
  undefined1 local_528 [88];
  undefined1 local_4d0 [64];
  undefined1 local_490 [64];
  undefined1 local_450 [64];
  Box local_410;
  byte local_3f1;
  Array4<const_double> local_3f0;
  undefined1 local_3b0 [128];
  Array4<const_double> local_330;
  Array4<const_double> local_2f0;
  Array4<const_double> local_2b0;
  Array4<const_double> local_270;
  Array4<const_double> local_230;
  Array4<const_amrex::EBCellFlag> local_1f0;
  Array4<const_amrex::EBCellFlag> *local_1b0;
  EBCellFlagFab *local_1a8;
  byte local_19c;
  byte local_19b;
  byte local_19a;
  byte local_199;
  byte local_189;
  undefined4 local_164;
  int *local_160;
  EBCellFlagFab *local_158;
  undefined4 local_14c;
  int *local_148;
  undefined4 local_13c;
  int *local_138;
  char *local_130;
  Dim3 local_128;
  Dim3 local_114;
  Dim3 local_108;
  Dim3 local_f8;
  int local_ec;
  Box *local_e8;
  EBCellFlag *local_e0;
  Dim3 local_d8;
  Box *local_c8;
  int local_bc;
  int iStack_b8;
  int local_b4;
  Dim3 local_b0;
  Box *local_a0;
  int local_98;
  int iStack_94;
  int local_90;
  undefined4 local_8c;
  IntVect *local_88;
  undefined4 local_7c;
  IntVect *local_78;
  undefined4 local_6c;
  IntVect *local_68;
  undefined4 local_5c;
  Box *local_58;
  undefined4 local_4c;
  Box *local_48;
  undefined4 local_3c;
  Box *local_38;
  undefined1 auVar10 [12];
  
  bVar6 = 0;
  local_189 = in_stack_00000028 & 1;
  local_199 = in_stack_00000148 & 1;
  local_19a = in_stack_00000150 & 1;
  local_19b = in_stack_00000158 & 1;
  local_19c = in_stack_00000160 & 1;
  local_164 = in_ESI;
  local_160 = in_RDI;
  amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab((EBFArrayBoxFactory *)in_stack_fffffffffffff270);
  local_1a8 = amrex::FabArray<amrex::EBCellFlagFab>::operator[]
                        ((FabArray<amrex::EBCellFlagFab> *)in_stack_fffffffffffff270,
                         in_stack_fffffffffffff268);
  local_e0 = (local_1a8->super_BaseFab<amrex::EBCellFlag>).dptr;
  local_e8 = &(local_1a8->super_BaseFab<amrex::EBCellFlag>).domain;
  local_ec = (local_1a8->super_BaseFab<amrex::EBCellFlag>).nvar;
  local_3c = 0;
  local_bc = (local_e8->smallend).vect[0];
  local_4c = 1;
  iStack_b8 = (local_1a8->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
  local_108.x = (local_e8->smallend).vect[0];
  local_108.y = (local_e8->smallend).vect[1];
  local_5c = 2;
  local_108.z = (local_1a8->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
  local_68 = &(local_1a8->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
  local_6c = 0;
  local_98 = local_68->vect[0] + 1;
  local_78 = &(local_1a8->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
  local_7c = 1;
  iStack_94 = (local_1a8->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
  local_88 = &(local_1a8->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
  local_8c = 2;
  local_128.z = (local_1a8->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
  local_128.y = iStack_94;
  local_128.x = local_98;
  local_158 = local_1a8;
  local_114._0_8_ = local_128._0_8_;
  local_114.z = local_128.z;
  local_f8._0_8_ = local_108._0_8_;
  local_f8.z = local_108.z;
  local_d8._0_8_ = local_108._0_8_;
  local_d8.z = local_108.z;
  local_c8 = local_e8;
  local_b4 = local_108.z;
  local_b0._0_8_ = local_128._0_8_;
  local_b0.z = local_128.z;
  local_a0 = local_e8;
  local_90 = local_128.z;
  local_58 = local_e8;
  local_48 = local_e8;
  local_38 = local_e8;
  amrex::Array4<const_amrex::EBCellFlag>::Array4(&local_1f0,local_e0,&local_f8,&local_114,local_ec);
  local_1b0 = &local_1f0;
  amrex::Array4<const_double>::Array4(&local_230);
  amrex::Array4<const_double>::Array4(&local_270);
  amrex::Array4<const_double>::Array4(&local_2b0);
  amrex::Array4<const_double>::Array4(&local_2f0);
  amrex::Array4<const_double>::Array4(&local_330);
  amrex::Array4<const_double>::Array4((Array4<const_double> *)(local_3b0 + 0x40));
  amrex::Array4<const_double>::Array4((Array4<const_double> *)local_3b0);
  amrex::Array4<const_double>::Array4(&local_3f0);
  FVar2 = amrex::EBCellFlagFab::getType(in_stack_fffffffffffff398,in_stack_fffffffffffff390);
  if (FVar2 != covered) {
    local_138 = local_160;
    local_13c = 3;
    local_410.smallend.vect._0_8_ = *(undefined8 *)local_160;
    local_410.smallend.vect[2] = local_160[2];
    local_410.bigend.vect[0] = local_160[3];
    local_410.bigend.vect._4_8_ = *(undefined8 *)(local_160 + 4);
    local_410.btype.itype = local_160[6];
    amrex::Box::grow(&local_410,3);
    FVar2 = amrex::EBCellFlagFab::getType(in_stack_fffffffffffff398,in_stack_fffffffffffff390);
    local_3f1 = FVar2 == regular;
    if (!(bool)local_3f1) {
      amrex::EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff270);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff278,(MFIter *)in_stack_fffffffffffff270);
      memcpy(&local_330,local_450,0x3c);
      amrex::EBFArrayBoxFactory::getCentroid((EBFArrayBoxFactory *)in_stack_fffffffffffff270);
      amrex::MultiCutFab::const_array(in_stack_fffffffffffff270,in_stack_fffffffffffff268);
      memcpy(&local_2f0,local_490,0x3c);
      amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff270);
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff270,
                 (size_type)in_stack_fffffffffffff268);
      amrex::MultiCutFab::const_array(in_stack_fffffffffffff270,in_stack_fffffffffffff268);
      memcpy(local_3b0 + 0x40,local_4d0,0x3c);
      amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff270);
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff270,
                 (size_type)in_stack_fffffffffffff268);
      amrex::MultiCutFab::const_array(in_stack_fffffffffffff270,in_stack_fffffffffffff268);
      memcpy(local_3b0,local_528,0x3c);
      amrex::EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff270);
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff270,
                 (size_type)in_stack_fffffffffffff268);
      amrex::MultiCutFab::const_array(in_stack_fffffffffffff270,in_stack_fffffffffffff268);
      memcpy(&local_3f0,local_580,0x3c);
      amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_fffffffffffff270);
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff270,
                 (size_type)in_stack_fffffffffffff268);
      amrex::MultiCutFab::const_array(in_stack_fffffffffffff270,in_stack_fffffffffffff268);
      memcpy(&local_230,&stack0xfffffffffffffa28,0x3c);
      amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_fffffffffffff270);
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff270,
                 (size_type)in_stack_fffffffffffff268);
      amrex::MultiCutFab::const_array(in_stack_fffffffffffff270,in_stack_fffffffffffff268);
      memcpy(&local_270,&stack0xfffffffffffff9d0,0x3c);
      amrex::EBFArrayBoxFactory::getFaceCent((EBFArrayBoxFactory *)in_stack_fffffffffffff270);
      std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff270,
                 (size_type)in_stack_fffffffffffff268);
      amrex::MultiCutFab::const_array(in_stack_fffffffffffff270,in_stack_fffffffffffff268);
      memcpy(&local_2b0,local_688,0x3c);
    }
    if ((local_189 & 1) == 0) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff270,(char *)in_stack_fffffffffffff268);
      if (bVar1) {
        if ((local_3f1 & 1) == 0) {
          amrex::Geometry::Domain((Geometry *)&stack0x00000058);
          local_d70 = in_stack_00000128;
          EBMOL::ComputeEdgeState
                    (in_stack_00000258,in_stack_00000250,in_stack_00000248,in_stack_00000240,
                     in_stack_00000238,in_stack_00000234,in_stack_000003a0,in_stack_000003a8,
                     in_stack_000003b0,in_stack_000003b8,in_stack_000003c0,in_stack_000003c8,
                     in_stack_000003d0,in_stack_000003d8,in_stack_000003e0,in_stack_000003e8,
                     in_stack_000003f0,in_stack_000003f8,(bool)in_stack_00000233);
        }
        else {
          amrex::Geometry::Domain((Geometry *)&stack0x00000058);
          local_d70 = in_stack_00000128;
          MOL::ComputeEdgeState
                    (in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
                     in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a4,
                     in_stack_fffffffffffffa10,in_stack_fffffffffffffa18,in_stack_fffffffffffffa20,
                     in_stack_fffffffffffffa28,in_stack_fffffffffffffa30,in_stack_fffffffffffffa38,
                     (bool)in_stack_fffffffffffff8a3);
        }
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff270,(char *)in_stack_fffffffffffff268);
        if (bVar1) {
          local_6a4 = 4;
          local_148 = local_160;
          local_14c = 4;
          local_70c[0].smallend.vect._0_8_ = *(undefined8 *)local_160;
          local_70c[0].smallend.vect[2] = local_160[2];
          local_70c[0].bigend.vect[0] = local_160[3];
          local_70c[0].bigend.vect._4_8_ = *(undefined8 *)(local_160 + 4);
          local_70c[0].btype.itype = local_160[6];
          amrex::Box::grow(local_70c,4);
          amrex::FArrayBox::FArrayBox
                    (in_stack_fffffffffffff280,(Box *)in_stack_fffffffffffff278,
                     (int)((ulong)in_stack_fffffffffffff270 >> 0x20),
                     SUB81((ulong)in_stack_fffffffffffff270 >> 0x18,0),
                     SUB81((ulong)in_stack_fffffffffffff270 >> 0x10,0),
                     (Arena *)in_stack_fffffffffffff268);
          n = (int)((ulong)in_stack_fffffffffffff280 >> 0x20);
          amrex::BaseFab<double>::elixir<double,_0>(in_stack_fffffffffffff298);
          if ((local_3f1 & 1) == 0) {
            amrex::BaseFab<double>::dataPtr(in_stack_fffffffffffff288,n);
            local_d70 = (Geometry *)&stack0x00000058;
            EBGodunov::ComputeEdgeState
                      (in_stack_00002488,in_stack_00002484,in_stack_00002478,in_stack_00002470,
                       in_stack_00002468,in_stack_00002460,in_stack_00003cc0,in_stack_00003cc8,
                       in_stack_00003cd0,in_stack_00003cd8,in_stack_00003ce0,in_stack_00003ce8,
                       in_stack_00002458,in_stack_00003cf0,in_stack_00003cf8,in_stack_00003d00,
                       in_stack_00003d08,in_stack_00003d10,in_stack_00003d18,in_stack_00003d20,
                       in_stack_00003d28,in_stack_00003d30,in_stack_00003d38,in_stack_00003d40,
                       in_stack_00003d48,in_stack_00003d50,(bool)in_stack_00002457,in_stack_00003d60
                      );
          }
          else {
            memcpy(local_800,(Geometry *)&stack0x00000058,200);
            puVar4 = local_800;
            ppGVar5 = &local_d70;
            for (lVar3 = 0x19; lVar3 != 0; lVar3 = lVar3 + -1) {
              *ppGVar5 = (Geometry *)*puVar4;
              puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
              ppGVar5 = ppGVar5 + (ulong)bVar6 * -2 + 1;
            }
            Godunov::ComputeEdgeState
                      (in_stack_000020d0,in_stack_000020cc,in_stack_000020c0,in_stack_000020b8,
                       in_stack_000020b0,in_stack_000020a8,in_stack_000038f0,in_stack_000038f8,
                       in_stack_00003900,in_stack_00003908,in_stack_00003910,in_stack_00003918,
                       in_stack_000020a0,in_stack_000039e0,in_stack_000039e8,(bool)in_stack_0000209f
                       ,(bool)in_stack_0000209e,(bool)in_stack_0000209d);
          }
          amrex::Gpu::Elixir::~Elixir(in_stack_00000038);
          amrex::FArrayBox::~FArrayBox((FArrayBox *)0x9e8d48);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff270,(char *)in_stack_fffffffffffff268);
          if (bVar1) {
            bVar1 = amrex::EBFArrayBoxFactory::isAllRegular((EBFArrayBoxFactory *)0x9e8d77);
            if (!bVar1) {
              local_130 = "BDS is not available with EB";
              amrex::Abort_host((char *)in_stack_fffffffffffff280);
            }
            memcpy(&stack0xfffffffffffff738,(Geometry *)&stack0x00000058,200);
            puVar4 = (undefined8 *)&stack0xfffffffffffff738;
            ppGVar5 = &local_d70;
            for (lVar3 = 0x19; lVar3 != 0; lVar3 = lVar3 + -1) {
              *ppGVar5 = (Geometry *)*puVar4;
              puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
              ppGVar5 = ppGVar5 + (ulong)bVar6 * -2 + 1;
            }
            geom_00.super_CoordSys.dx[2]._7_1_ = in_stack_fffffffffffff75f;
            geom_00.super_CoordSys._0_55_ = in_stack_fffffffffffff728;
            geom_00.super_CoordSys.inv_dx[0] = (Real)in_stack_fffffffffffff760;
            geom_00.super_CoordSys.inv_dx[1] = (Real)in_stack_fffffffffffff768;
            geom_00.super_CoordSys.inv_dx[2] = (Real)in_stack_fffffffffffff770;
            geom_00.super_CoordSys._80_8_ = in_stack_fffffffffffff778;
            geom_00.prob_domain.xlo[0] = (Real)in_stack_fffffffffffff780;
            geom_00.prob_domain.xlo[1] = (Real)in_stack_fffffffffffff788;
            auVar7 = in_stack_fffffffffffff790._32_24_;
            auVar8 = in_stack_fffffffffffff790._56_12_;
            auVar9 = in_stack_fffffffffffff790._68_28_;
            geom_00.prob_domain.xlo[2] = (Real)in_stack_fffffffffffff790._0_8_;
            geom_00.prob_domain.xhi[0] = (Real)in_stack_fffffffffffff790._8_8_;
            geom_00.prob_domain.xhi[1] = (Real)in_stack_fffffffffffff790._16_8_;
            geom_00.prob_domain.xhi[2] = (Real)in_stack_fffffffffffff790._24_8_;
            geom_00.roundoff_hi_d.arr[0] = (double)auVar7._0_8_;
            geom_00.roundoff_hi_d.arr[1] = (double)auVar7._8_8_;
            geom_00.roundoff_hi_d.arr[2] = (double)auVar7._16_8_;
            geom_00.roundoff_hi_f.arr[0] = (float)auVar8._0_4_;
            geom_00.roundoff_hi_f.arr[1] = (float)auVar8._4_4_;
            geom_00.roundoff_hi_f.arr[2] = (float)auVar8._8_4_;
            auVar8 = auVar9._0_12_;
            auVar10 = auVar9._12_12_;
            geom_00.domain.smallend.vect[0] = auVar8._0_4_;
            geom_00.domain.smallend.vect[1] = auVar8._4_4_;
            geom_00.domain.smallend.vect[2] = auVar8._8_4_;
            geom_00.domain.bigend.vect[0] = auVar10._0_4_;
            geom_00.domain.bigend.vect[1] = auVar10._4_4_;
            geom_00.domain.bigend.vect[2] = auVar10._8_4_;
            geom_00.domain.btype.itype = auVar9._24_4_;
            BDS::ComputeEdgeState
                      (in_stack_fffffffffffff4c0,(int)((ulong)in_stack_fffffffffffff4b8 >> 0x20),
                       (Array4<const_double> *)
                       CONCAT44(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0),
                       in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0,in_stack_fffffffffffff498
                       ,in_stack_fffffffffffff700,in_stack_fffffffffffff708,
                       in_stack_fffffffffffff710,in_stack_fffffffffffff718,in_stack_fffffffffffff720
                       ,geom_00,in_stack_fffffffffffff490,in_stack_fffffffffffff7f0,
                       in_stack_fffffffffffff7f8,SUB41((uint)in_stack_fffffffffffff48c >> 0x18,0));
          }
          else {
            std::operator+(in_stack_fffffffffffff2b8,in_stack_fffffffffffff2b0);
            amrex::Abort((string *)in_stack_fffffffffffff268);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffff718);
          }
        }
      }
    }
    if ((local_3f1 & 1) == 0) {
      amrex::Array4<const_double>::Array4<const_double,_0>
                ((Array4<const_double> *)&stack0xfffffffffffff6d8,in_stack_00000010);
      amrex::Array4<const_double>::Array4<const_double,_0>(&local_968,in_stack_00000018);
      amrex::Array4<const_double>::Array4<const_double,_0>(&local_9a8,in_stack_00000020);
      local_d70 = (Geometry *)local_3b0;
      EB_ComputeFluxes(in_stack_fffffffffffff788,in_stack_fffffffffffff780,in_stack_fffffffffffff778
                       ,in_stack_fffffffffffff770,in_stack_fffffffffffff768,
                       in_stack_fffffffffffff760,in_stack_fffffffffffff990,in_stack_fffffffffffff998
                       ,in_stack_fffffffffffff9a0,in_stack_fffffffffffff9a8,
                       in_stack_fffffffffffff9b0,in_stack_fffffffffffff9b8,in_stack_fffffffffffff9c0
                       ,in_stack_fffffffffffff9c8,in_stack_fffffffffffff9d0,
                       in_stack_fffffffffffff9d8,(bool)in_stack_fffffffffffff75f);
    }
    else {
      amrex::Array4<const_double>::Array4<const_double,_0>(&local_9e8,in_stack_00000010);
      amrex::Array4<const_double>::Array4<const_double,_0>
                ((Array4<const_double> *)&stack0xfffffffffffff5d8,in_stack_00000018);
      amrex::Array4<const_double>::Array4<const_double,_0>(&local_a68,in_stack_00000020);
      local_d70 = (Geometry *)CONCAT44(local_d70._4_4_,local_164);
      ComputeFluxes(in_stack_fffffffffffff608,in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                    in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,
                    in_stack_fffffffffffff810,in_stack_fffffffffffff818,in_stack_fffffffffffff820,
                    in_stack_fffffffffffff828,in_stack_fffffffffffff830,in_stack_fffffffffffff838,
                    (bool)in_stack_fffffffffffff5df);
    }
  }
  return;
}

Assistant:

void
HydroUtils::ComputeFluxesOnBoxFromState (Box const& bx, int ncomp, MFIter& mfi,
                                         Array4<Real const> const& q,
                                         AMREX_D_DECL(Array4<Real> const& flux_x,
                                                      Array4<Real> const& flux_y,
                                                      Array4<Real> const& flux_z),
                                         AMREX_D_DECL(Array4<Real> const& face_x,
                                         Array4<Real> const& face_y,
                                                      Array4<Real> const& face_z),
                                         bool knownFaceState,
                                         AMREX_D_DECL(Array4<Real const> const& u_mac,
                                                      Array4<Real const> const& v_mac,
                                                      Array4<Real const> const& w_mac),
                                         Array4<Real const> const& divu,
                                         Array4<Real const> const& fq,
                                         Geometry geom, Real l_dt,
                                         Vector<BCRec> const& h_bcrec,
                                         const BCRec* d_bcrec,
                                         int const* iconserv,
#ifdef AMREX_USE_EB
                                         const EBFArrayBoxFactory& ebfact,
                                         Array4<Real const> const& values_on_eb_inflow,
#endif
                                         bool godunov_use_ppm, bool godunov_use_forces_in_trans,
                                         bool is_velocity, bool fluxes_are_area_weighted,
                                         std::string& advection_type)

{
#ifdef AMREX_USE_EB
    EBCellFlagFab const& flagfab = ebfact.getMultiEBCellFlagFab()[mfi];
    Array4<EBCellFlag const> const& flag = flagfab.const_array();

    Array4<Real const> AMREX_D_DECL(fcx, fcy, fcz), ccc, vfrac, AMREX_D_DECL(apx, apy, apz);

    // If entire box is covered, don't do anything and return
    if (flagfab.getType(bx) == FabType::covered)
        return;

    //FIXME? -- Godunov needs to check on grow 3, but MOL only needs 2
    bool regular = (flagfab.getType(amrex::grow(bx,3)) == FabType::regular);

    if (!regular)
    {
        vfrac = ebfact.getVolFrac().const_array(mfi);
        ccc   = ebfact.getCentroid().const_array(mfi);

        AMREX_D_TERM( apx = ebfact.getAreaFrac()[0]->const_array(mfi);,
                      apy = ebfact.getAreaFrac()[1]->const_array(mfi);,
                      apz = ebfact.getAreaFrac()[2]->const_array(mfi););

        AMREX_D_TERM( fcx = ebfact.getFaceCent()[0]->const_array(mfi);,
                      fcy = ebfact.getFaceCent()[1]->const_array(mfi);,
                      fcz = ebfact.getFaceCent()[2]->const_array(mfi););
    }
#endif

    if (!knownFaceState) {
        if (advection_type == "MOL")
        {
#ifdef AMREX_USE_EB
            if (!regular)
                EBMOL::ComputeEdgeState( bx,
                                         AMREX_D_DECL(face_x,face_y,face_z),
                                         q, ncomp,
                                         AMREX_D_DECL(u_mac,v_mac,w_mac),
                                         geom.Domain(), h_bcrec, d_bcrec,
                                         AMREX_D_DECL(fcx,fcy,fcz),
                                         ccc, vfrac, flag,
                                         is_velocity);
            else
#endif
                MOL::ComputeEdgeState( bx,
                                       AMREX_D_DECL(face_x,face_y,face_z),
                                       q, ncomp,
                                       AMREX_D_DECL(u_mac,v_mac,w_mac),
                                       geom.Domain(), h_bcrec, d_bcrec,
                                               is_velocity);

        } else if (advection_type == "Godunov") {

            int ngrow = 4; // NOT SURE ABOUT THIS
            FArrayBox tmpfab_v(amrex::grow(bx,ngrow),  (4*AMREX_SPACEDIM + 2)*ncomp);
            Elixir    eli = tmpfab_v.elixir();
#ifdef AMREX_USE_EB
            if (!regular)
                EBGodunov::ComputeEdgeState(bx, ncomp, q,
                                            AMREX_D_DECL(face_x,face_y,face_z),
                                            AMREX_D_DECL(u_mac,v_mac,w_mac),
                                            divu, fq,
                                            geom, l_dt,
                                            h_bcrec, d_bcrec, iconserv,
                                            tmpfab_v.dataPtr(), flag,
                                            AMREX_D_DECL(apx,apy,apz), vfrac,
                                            AMREX_D_DECL(fcx,fcy,fcz), ccc,
                                            is_velocity,
                                            values_on_eb_inflow);
            else
#endif

                Godunov::ComputeEdgeState(bx, ncomp, q,
                                          AMREX_D_DECL(face_x,face_y,face_z),
                                          AMREX_D_DECL(u_mac,v_mac,w_mac),
                                          divu, fq,
                                          geom,
                                          l_dt, d_bcrec, iconserv,
                                          godunov_use_ppm, godunov_use_forces_in_trans,
                                             is_velocity);
        } else if (advection_type == "BDS") {
#ifdef AMREX_USE_EB
            if (!ebfact.isAllRegular()) Abort("BDS is not available with EB");
#endif
            BDS::ComputeEdgeState( bx, ncomp, q,
                                   AMREX_D_DECL(face_x,face_y,face_z),
                                   AMREX_D_DECL(u_mac,v_mac,w_mac),
                                   divu, fq, geom,
                                   l_dt, d_bcrec, iconserv,
                                   is_velocity);
        } else {
            Abort("Unknown advection_type: "+advection_type);
        } // test advection type
    } // known face state

    // Compute fluxes
#ifdef AMREX_USE_EB
    if (!regular) {
        HydroUtils::EB_ComputeFluxes( bx,
                                      AMREX_D_DECL(flux_x,flux_y,flux_z),
                                      AMREX_D_DECL(u_mac,v_mac,w_mac),
                                      AMREX_D_DECL(face_x,face_y,face_z),
                                      AMREX_D_DECL(apx,apy,apz),
                                      geom, ncomp,
                                      flag, fluxes_are_area_weighted);
    } else
#endif
    {
        HydroUtils::ComputeFluxes( bx,
                                   AMREX_D_DECL(flux_x,flux_y,flux_z),
                                   AMREX_D_DECL(u_mac,v_mac,w_mac),
                                   AMREX_D_DECL(face_x,face_y,face_z),
                                   geom, ncomp, fluxes_are_area_weighted );
    }
}